

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm.c
# Opt level: O0

void asm_snap_alloc(ASMState *as,int snapno)

{
  byte bVar1;
  uint uVar2;
  long lVar3;
  uint *puVar4;
  int in_ESI;
  long in_RDI;
  IRRef ref;
  SnapEntry sn;
  MSize nent;
  MSize n;
  SnapEntry *map;
  SnapShot *snap;
  undefined4 local_24;
  undefined4 in_stack_fffffffffffffff0;
  
  puVar4 = (uint *)(*(long *)(*(long *)(in_RDI + 0x110) + 0x20) + (long)in_ESI * 0xc);
  lVar3 = *(long *)(*(long *)(in_RDI + 0x110) + 0x28);
  uVar2 = *puVar4;
  bVar1 = *(byte *)((long)puVar4 + 10);
  *(undefined8 *)(in_RDI + 0xf0) = 0;
  *(undefined8 *)(in_RDI + 0xe8) = 0;
  for (local_24 = 0; local_24 < bVar1; local_24 = local_24 + 1) {
    if (0x7fff < (*(uint *)(lVar3 + (ulong)uVar2 * 4 + (ulong)local_24 * 4) & 0xffff)) {
      asm_snap_alloc1((ASMState *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                      (IRRef)((ulong)puVar4 >> 0x20));
    }
  }
  return;
}

Assistant:

static void asm_snap_alloc(ASMState *as, int snapno)
{
  SnapShot *snap = &as->T->snap[snapno];
  SnapEntry *map = &as->T->snapmap[snap->mapofs];
  MSize n, nent = snap->nent;
  as->snapfilt1 = as->snapfilt2 = 0;
  for (n = 0; n < nent; n++) {
    SnapEntry sn = map[n];
    IRRef ref = snap_ref(sn);
    if (!irref_isk(ref)) {
      asm_snap_alloc1(as, ref);
      if (LJ_SOFTFP && (sn & SNAP_SOFTFPNUM)) {
	lj_assertA(irt_type(IR(ref+1)->t) == IRT_SOFTFP,
		   "snap %d[%d] points to bad SOFTFP IR %04d",
		   snapno, n, ref - REF_BIAS);
	asm_snap_alloc1(as, ref+1);
      }
    }
  }
}